

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

void Llb_NonlinRemovePart(Llb_Mgr_t *p,Llb_Prt_t *pPart)

{
  Llb_Prt_t *pPart_local;
  Llb_Mgr_t *p_local;
  
  if (p->pParts[pPart->iPart] != pPart) {
    __assert_fail("p->pParts[pPart->iPart] == pPart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                  ,0x79,"void Llb_NonlinRemovePart(Llb_Mgr_t *, Llb_Prt_t *)");
  }
  p->pParts[pPart->iPart] = (Llb_Prt_t *)0x0;
  Vec_IntFree(pPart->vVars);
  Cudd_RecursiveDeref(p->dd,pPart->bFunc);
  if (pPart != (Llb_Prt_t *)0x0) {
    free(pPart);
  }
  return;
}

Assistant:

void Llb_NonlinRemovePart( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    assert( p->pParts[pPart->iPart] == pPart );
    p->pParts[pPart->iPart] = NULL;
    Vec_IntFree( pPart->vVars );
    Cudd_RecursiveDeref( p->dd, pPart->bFunc );
    ABC_FREE( pPart );
}